

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::walkFunctionInModule
          (Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *this,Function *func,
          Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  doWalkFunction(this,func);
  ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
  equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::
  LocalizerPass::visitFunction(wasm::Function__(this[-1].stack.fixed._M_elems + 7,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }